

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::Texture2D::sample4(Texture2D *this,Vec4 *output,Vec2 *packetTexcoords,float lodBias)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int fragNdx;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  TextureFormat local_40;
  TextureFormat TStack_38;
  
  if ((this->m_view).m_numLevels < 1) {
    fVar19 = 0.0;
    fVar20 = 0.0;
  }
  else {
    uVar1 = *(undefined8 *)(((this->m_view).m_levels)->m_size).m_data;
    fVar19 = (float)(int)uVar1;
    fVar20 = (float)(int)((ulong)uVar1 >> 0x20);
  }
  fVar16 = (float)*(undefined8 *)packetTexcoords[3].m_data;
  fVar18 = (float)((ulong)*(undefined8 *)packetTexcoords[3].m_data >> 0x20);
  fVar10 = (float)*(undefined8 *)packetTexcoords[1].m_data;
  fVar13 = (float)((ulong)*(undefined8 *)packetTexcoords[1].m_data >> 0x20);
  auVar3._4_4_ = fVar18 - fVar13;
  auVar3._0_4_ = fVar16 - fVar10;
  fVar7 = (float)*(undefined8 *)packetTexcoords->m_data;
  fVar9 = (float)((ulong)*(undefined8 *)packetTexcoords->m_data >> 0x20);
  fVar15 = (float)*(undefined8 *)packetTexcoords[2].m_data;
  fVar17 = (float)((ulong)*(undefined8 *)packetTexcoords[2].m_data >> 0x20);
  auVar2._4_4_ = fVar18 - fVar17;
  auVar2._0_4_ = fVar16 - fVar15;
  uVar4 = 0;
  do {
    auVar12._0_8_ =
         CONCAT44((int)((uint)(uVar4 < 2) << 0x1f) >> 0x1f,(int)((uint)(uVar4 < 2) << 0x1f) >> 0x1f)
    ;
    auVar12._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = CONCAT44(fVar13 - fVar9,fVar10 - fVar7) & auVar12._0_8_;
    auVar2._8_8_ = 0;
    auVar11 = ~auVar12 & auVar2 | auVar11;
    auVar12 = maxps(auVar11 ^ _DAT_00ad8f80,auVar11);
    uVar5 = (uint)((uVar4 & 1) == 0);
    auVar8._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
    auVar8._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = CONCAT44(fVar17 - fVar9,fVar15 - fVar7) & auVar8._0_8_;
    auVar3._8_8_ = 0;
    auVar14 = ~auVar8 & auVar3 | auVar14;
    auVar11 = maxps(auVar14 ^ _DAT_00ad8f80,auVar14);
    uVar5 = -(uint)(auVar11._0_4_ <= auVar12._0_4_);
    uVar6 = -(uint)(auVar11._4_4_ <= auVar12._4_4_);
    fVar16 = (float)(~uVar5 & (uint)auVar11._0_4_ | (uint)auVar12._0_4_ & uVar5) * fVar19;
    fVar18 = (float)(~uVar6 & (uint)auVar11._4_4_ | (uint)auVar12._4_4_ & uVar6) * fVar20;
    uVar5 = -(uint)(fVar18 <= fVar16);
    fVar16 = logf((float)(~uVar5 & (uint)fVar18 | (uint)fVar16 & uVar5));
    tcu::sampleLevelArray2D
              ((ConstPixelBufferAccess *)&local_40,(int)(this->m_view).m_levels,
               (Sampler *)(ulong)(uint)(this->m_view).m_numLevels,packetTexcoords[uVar4].m_data[0],
               packetTexcoords[uVar4].m_data[1],(int)this + 0x18,fVar16 * 1.442695 + lodBias);
    *(TextureFormat *)output = local_40;
    *(TextureFormat *)((long)output + 8) = TStack_38;
    uVar4 = uVar4 + 1;
    output = (Vec4 *)((long)output + 0x10);
  } while (uVar4 != 4);
  return;
}

Assistant:

void Texture2D::sample4 (tcu::Vec4 output[4], const tcu::Vec2 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec2 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec2 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec2 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec2 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), lod);
	}
}